

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<int,short>(void)

{
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_00;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_01;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_00;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_02;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_01;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_02;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_03;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_03;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_04;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_05;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_06;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_04;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_07;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_08;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_09;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_05;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_10;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_11;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_12;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_06;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_13;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_07;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_08;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_09;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_10;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_11;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_12;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_13;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_14;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_15;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_16;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_17;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_18;
  short u2;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st2;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st;
  bool b;
  int t;
  short u;
  undefined6 in_stack_fffffffffffffe58;
  short in_stack_fffffffffffffe5e;
  undefined2 in_stack_fffffffffffffe60;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe62;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe64;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe66;
  undefined4 in_stack_fffffffffffffe68;
  undefined2 in_stack_fffffffffffffe6c;
  short in_stack_fffffffffffffe6e;
  undefined2 in_stack_fffffffffffffe70;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe72;
  undefined2 in_stack_fffffffffffffe74;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe76;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_12 [4];
  byte local_9;
  int local_8;
  short local_2;
  
  local_2 = 0;
  local_8 = 0;
  local_9 = 0;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<short>((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                             CONCAT24(in_stack_fffffffffffffe64.m_int,
                                      CONCAT22(in_stack_fffffffffffffe62.m_int,
                                               in_stack_fffffffffffffe60))),
                 (short *)CONCAT26(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (local_12,&local_2);
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<short>((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT26(in_stack_fffffffffffffe76.m_int,
                             CONCAT24(in_stack_fffffffffffffe74,
                                      CONCAT22(in_stack_fffffffffffffe72.m_int,
                                               in_stack_fffffffffffffe70))),
                 (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT26(in_stack_fffffffffffffe6e,
                             CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  local_9 = (local_9 ^ 0xff) & 1;
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe76.m_int,
                       CONCAT24(in_stack_fffffffffffffe74,
                                CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70))
                      ),
             (int *)CONCAT26(in_stack_fffffffffffffe6e,
                             CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe76.m_int,
                       CONCAT24(in_stack_fffffffffffffe74,
                                CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70))
                      ),
             (short *)CONCAT26(in_stack_fffffffffffffe6e,
                               CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe66.m_int,
                       CONCAT24(in_stack_fffffffffffffe64.m_int,
                                CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60))
                      ),
             (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58));
  SafeInt::operator_cast_to_short
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe66.m_int,
                       CONCAT24(in_stack_fffffffffffffe64.m_int,
                                CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60))
                      ));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58),0);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs_07.m_int._2_2_ = in_stack_fffffffffffffe72.m_int;
  rhs_07.m_int._0_2_ = in_stack_fffffffffffffe70;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator*
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),rhs_07);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs.m_int._2_2_ = in_stack_fffffffffffffe62.m_int;
  rhs.m_int._0_2_ = in_stack_fffffffffffffe60;
  operator*(in_stack_fffffffffffffe5e,rhs);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe66.m_int,
                       CONCAT24(in_stack_fffffffffffffe64.m_int,
                                CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60))
                      ),in_stack_fffffffffffffe5e);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58),
             in_stack_fffffffffffffe66);
  local_2 = 1;
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe76.m_int,
                       CONCAT24(in_stack_fffffffffffffe74,
                                CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70))
                      ),
             (int *)CONCAT26(in_stack_fffffffffffffe6e,
                             CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffe76.m_int,
                         CONCAT24(in_stack_fffffffffffffe74,
                                  CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70
                                          ))),
             (int *)CONCAT26(in_stack_fffffffffffffe6e,
                             CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58),0);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe76.m_int,
                       CONCAT24(in_stack_fffffffffffffe74,
                                CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70))
                      ),
             (int *)CONCAT26(in_stack_fffffffffffffe6e,
                             CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  rhs_08.m_int._2_2_ = in_stack_fffffffffffffe72.m_int;
  rhs_08.m_int._0_2_ = in_stack_fffffffffffffe70;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator%
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),rhs_08);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe66.m_int,
                       CONCAT24(in_stack_fffffffffffffe64.m_int,
                                CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60))
                      ),in_stack_fffffffffffffe5e);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe76);
  local_2 = 1;
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe76.m_int,
                       CONCAT24(in_stack_fffffffffffffe74,
                                CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70))
                      ),
             (int *)CONCAT26(in_stack_fffffffffffffe6e,
                             CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe76.m_int,
                       CONCAT24(in_stack_fffffffffffffe74,
                                CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70))
                      ),
             (int *)CONCAT26(in_stack_fffffffffffffe6e,
                             CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58),0);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs_09.m_int._2_2_ = in_stack_fffffffffffffe72.m_int;
  rhs_09.m_int._0_2_ = in_stack_fffffffffffffe70;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator/
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),rhs_09);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs_10.m_int._2_2_ = in_stack_fffffffffffffe72.m_int;
  rhs_10.m_int._0_2_ = in_stack_fffffffffffffe70;
  operator/(in_stack_fffffffffffffe6e,rhs_10);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe66.m_int,
                       CONCAT24(in_stack_fffffffffffffe64.m_int,
                                CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60))
                      ),in_stack_fffffffffffffe5e);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe76);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58),0);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs_11.m_int._2_2_ = in_stack_fffffffffffffe72.m_int;
  rhs_11.m_int._0_2_ = in_stack_fffffffffffffe70;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator+
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),rhs_11);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs_00.m_int._2_2_ = in_stack_fffffffffffffe62.m_int;
  rhs_00.m_int._0_2_ = in_stack_fffffffffffffe60;
  operator+(in_stack_fffffffffffffe5e,rhs_00);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe66.m_int,
                       CONCAT24(in_stack_fffffffffffffe64.m_int,
                                CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60))
                      ),in_stack_fffffffffffffe5e);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe76);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe76.m_int,
                       CONCAT24(in_stack_fffffffffffffe74,
                                CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70))
                      ),
             (int *)CONCAT26(in_stack_fffffffffffffe6e,
                             CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  local_2 = 0;
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe76.m_int,
                       CONCAT24(in_stack_fffffffffffffe74,
                                CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70))
                      ),
             (int *)CONCAT26(in_stack_fffffffffffffe6e,
                             CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58),0);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs_12.m_int._2_2_ = in_stack_fffffffffffffe72.m_int;
  rhs_12.m_int._0_2_ = in_stack_fffffffffffffe70;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator-
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),rhs_12);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs_01.m_int._2_2_ = in_stack_fffffffffffffe62.m_int;
  rhs_01.m_int._0_2_ = in_stack_fffffffffffffe60;
  operator-(in_stack_fffffffffffffe5e,rhs_01);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe66.m_int,
                       CONCAT24(in_stack_fffffffffffffe64.m_int,
                                CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60))
                      ),in_stack_fffffffffffffe5e);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe76.m_int,
                       CONCAT24(in_stack_fffffffffffffe74,
                                CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70))
                      ),
             (int *)CONCAT26(in_stack_fffffffffffffe6e,
                             CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffe76.m_int,
                         CONCAT24(in_stack_fffffffffffffe74,
                                  CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70
                                          ))),
             (int *)CONCAT26(in_stack_fffffffffffffe6e,
                             CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe76);
  local_2 = 1;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffe76.m_int,
                         CONCAT24(in_stack_fffffffffffffe74,
                                  CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70
                                          ))),
             (int *)CONCAT26(in_stack_fffffffffffffe6e,
                             CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe66.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe72);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  operator<<(CONCAT22(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe6c),in_stack_fffffffffffffe72
            );
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe66.m_int,
                       CONCAT24(in_stack_fffffffffffffe64.m_int,
                                CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60))
                      ),in_stack_fffffffffffffe5e);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe76);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe66.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe72);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  operator>>(CONCAT22(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe6c),in_stack_fffffffffffffe72
            );
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe66.m_int,
                       CONCAT24(in_stack_fffffffffffffe64.m_int,
                                CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60))
                      ),in_stack_fffffffffffffe5e);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe76);
  rhs_13.m_int._2_2_ = in_stack_fffffffffffffe72.m_int;
  rhs_13.m_int._0_2_ = in_stack_fffffffffffffe70;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),rhs_13);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58),0);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  operator&(CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60),
            in_stack_fffffffffffffe64);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs_16.m_int._2_2_ = in_stack_fffffffffffffe76.m_int;
  rhs_16.m_int._0_2_ = in_stack_fffffffffffffe74;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),rhs_16);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe66.m_int,
                       CONCAT24(in_stack_fffffffffffffe64.m_int,
                                CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60))
                      ),in_stack_fffffffffffffe5e);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe76);
  rhs_14.m_int._2_2_ = in_stack_fffffffffffffe72.m_int;
  rhs_14.m_int._0_2_ = in_stack_fffffffffffffe70;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator|
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),rhs_14);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58),0);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  operator|(CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60),
            in_stack_fffffffffffffe64);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs_17.m_int._2_2_ = in_stack_fffffffffffffe76.m_int;
  rhs_17.m_int._0_2_ = in_stack_fffffffffffffe74;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator|=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),rhs_17);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe66.m_int,
                       CONCAT24(in_stack_fffffffffffffe64.m_int,
                                CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60))
                      ),in_stack_fffffffffffffe5e);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe76);
  rhs_15.m_int._2_2_ = in_stack_fffffffffffffe72.m_int;
  rhs_15.m_int._0_2_ = in_stack_fffffffffffffe70;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator^
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),rhs_15);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58),0);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  operator^(CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60),
            in_stack_fffffffffffffe64);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs_18.m_int._2_2_ = in_stack_fffffffffffffe76.m_int;
  rhs_18.m_int._0_2_ = in_stack_fffffffffffffe74;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator^=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),rhs_18);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe66.m_int,
                       CONCAT24(in_stack_fffffffffffffe64.m_int,
                                CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60))
                      ),in_stack_fffffffffffffe5e);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe76);
  lhs.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator<(lhs,in_stack_fffffffffffffe62);
  lhs_00.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs_00.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator<(lhs_00,in_stack_fffffffffffffe62.m_int);
  rhs_02.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  rhs_02.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator<(in_stack_fffffffffffffe62.m_int,rhs_02);
  lhs_01.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs_01.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator<(lhs_01,in_stack_fffffffffffffe62);
  lhs_02.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs_02.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator<=(lhs_02,in_stack_fffffffffffffe62);
  lhs_03.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs_03.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator<=(lhs_03,in_stack_fffffffffffffe62.m_int);
  rhs_03.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  rhs_03.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator<=(in_stack_fffffffffffffe62.m_int,rhs_03);
  lhs_04.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs_04.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator<=(lhs_04,in_stack_fffffffffffffe62);
  lhs_05.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs_05.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator>(lhs_05,in_stack_fffffffffffffe62);
  lhs_06.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs_06.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator>(lhs_06,in_stack_fffffffffffffe62.m_int);
  rhs_04.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  rhs_04.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator>(in_stack_fffffffffffffe62.m_int,rhs_04);
  lhs_07.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs_07.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator>(lhs_07,in_stack_fffffffffffffe62);
  lhs_08.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs_08.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator>=(lhs_08,in_stack_fffffffffffffe62);
  lhs_09.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs_09.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator>=(lhs_09,in_stack_fffffffffffffe62.m_int);
  rhs_05.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  rhs_05.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator>=(in_stack_fffffffffffffe62.m_int,rhs_05);
  lhs_10.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs_10.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator>=(lhs_10,in_stack_fffffffffffffe62);
  lhs_11.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs_11.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator==(lhs_11,in_stack_fffffffffffffe62);
  lhs_12.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs_12.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator==(lhs_12,in_stack_fffffffffffffe62.m_int);
  rhs_06.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  rhs_06.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator==(in_stack_fffffffffffffe62.m_int,rhs_06);
  lhs_13.m_int._2_2_ = local_12[0].m_int;
  lhs_13.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  operator==(lhs_13,in_stack_fffffffffffffe62);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}